

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
          (SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *this,
          DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015bc47d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",5);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndContinueInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndContinue"
                    );
  DebugWriter::Print(w,L"(");
  Char2Mixin::Print(&(this->super_Char2LiteralScannerMixin).super_Char2Mixin,w,litbuf_00);
  DebugWriter::Print(w,L" (with two character literal scanner)");
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015bc47d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::Char2LiteralScannerMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Char2LiteralScannerMixin,
               L"Char2LiteralScannerMixin");
    DebugWriter::Unindent(w);
  }
  return 5;
}

Assistant:

int SyncToLiteralAndContinueInstT<Char2LiteralScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndContinueInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndContinue");
        PRINT_MIXIN(Char2LiteralScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(Char2LiteralScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_RE_BYTECODE_END();
    }